

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleQualifierRenderCase::init
          (SampleQualifierRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *this_00;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  EVP_PKEY_CTX *ctx_00;
  bool local_332;
  bool local_331;
  MessageBuilder local_328;
  MessageBuilder local_198;
  bool local_11;
  SampleQualifierRenderCase *pSStack_10;
  bool isSingleSampleTarget;
  SampleQualifierRenderCase *this_local;
  
  pSStack_10 = this;
  if (((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.m_renderTarget ==
       TARGET_DEFAULT) ||
     (local_331 = true,
     (this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.m_numRequestedSamples
     != 0)) {
    local_332 = false;
    if ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.m_renderTarget ==
        TARGET_DEFAULT) {
      this_00 = gles31::Context::getRenderTarget
                          ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase
                           .super_TestCase.m_context);
      iVar1 = tcu::RenderTarget::getNumSamples(this_00);
      local_332 = iVar1 < 2;
    }
    local_331 = local_332;
  }
  local_11 = local_331;
  if (local_331 == false) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_328,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_328,
                        (char (*) [92])
                        "Verifying that a sample-qualified varying is given different values for different samples.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [61])
                               "\tRender high-frequency function, map result to black/white.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [74])
                               "\t=> Resulting image should contain n+1 shades of gray, n = sample count.\n"
                       );
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_198,
                        (char (*) [92])
                        "Verifying that a sample-qualified varying is given different values for different samples.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [61])
                               "\tRender high-frequency function, map result to black/white.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [71])
                               "\t=> Resulting image image should contain both black and white pixels.\n"
                       );
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
  }
  iVar1 = MultisampleShadeCountRenderCase::init(&this->super_MultisampleShadeCountRenderCase,ctx_00)
  ;
  return iVar1;
}

Assistant:

void SampleQualifierRenderCase::init (void)
{
	const bool isSingleSampleTarget = (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);

	// test purpose and expectations
	if (isSingleSampleTarget)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that a sample-qualified varying is given different values for different samples.\n"
			<< "	Render high-frequency function, map result to black/white.\n"
			<< "	=> Resulting image image should contain both black and white pixels.\n"
			<< tcu::TestLog::EndMessage;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that a sample-qualified varying is given different values for different samples.\n"
			<< "	Render high-frequency function, map result to black/white.\n"
			<< "	=> Resulting image should contain n+1 shades of gray, n = sample count.\n"
			<< tcu::TestLog::EndMessage;
	}

	MultisampleShadeCountRenderCase::init();
}